

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmvec.cpp
# Opt level: O0

int __thiscall
CVmObjVector::set_index_val_q
          (CVmObjVector *this,vm_val_t *new_container,vm_obj_id_t self,vm_val_t *index_val,
          vm_val_t *new_val)

{
  uint uVar1;
  ulong idx_00;
  size_t sVar2;
  vm_obj_id_t in_EDX;
  vm_val_t *in_RSI;
  vm_val_t *in_RDI;
  vm_val_t nil_val;
  size_t i;
  int32_t idx;
  vm_val_t *in_stack_ffffffffffffffb8;
  anon_union_8_8_cb74652f_for_val in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  vm_obj_id_t self_00;
  undefined4 in_stack_ffffffffffffffd0;
  
  self_00 = (vm_obj_id_t)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  uVar1 = vm_val_t::num_to_int(in_RDI);
  if ((int)uVar1 < 1) {
    err_throw(0);
  }
  idx_00 = (ulong)uVar1;
  sVar2 = get_element_count((CVmObjVector *)0x34ee37);
  if (sVar2 < idx_00) {
    sVar2 = get_element_count((CVmObjVector *)0x34ee4d);
    set_element_count_undo((CVmObjVector *)new_val,idx,i);
    vm_val_t::set_nil((vm_val_t *)&stack0xffffffffffffffb8);
    for (; sVar2 < (long)(int)uVar1 - 1U; sVar2 = sVar2 + 1) {
      set_element((CVmObjVector *)in_RDI,idx_00,(vm_val_t *)0x34ee96);
    }
    set_element((CVmObjVector *)in_RDI,idx_00,(vm_val_t *)0x34eebf);
  }
  else {
    set_element_undo((CVmObjVector *)CONCAT44(uVar1,in_stack_ffffffffffffffd0),self_00,
                     (size_t)in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  vm_val_t::set_obj(in_RSI,in_EDX);
  return 1;
}

Assistant:

int CVmObjVector::set_index_val_q(VMG_ vm_val_t *new_container,
                                  vm_obj_id_t self,
                                  const vm_val_t *index_val,
                                  const vm_val_t *new_val)
{
    /* get the index value as an integer */
    int32_t idx = index_val->num_to_int(vmg0_);

    /* make sure it's at least 1 */
    if (idx < 1)
        err_throw(VMERR_INDEX_OUT_OF_RANGE);

    /* 
     *   if it's higher than the current length, extend the vector with nil
     *   entries to the requested size 
     */
    if ((uint32_t)idx > get_element_count())
    {
        size_t i;
        vm_val_t nil_val;
        
        /* note the first new element index */
        i = get_element_count();

        /* extend the vector */
        set_element_count_undo(vmg_ self, idx);

        /* 
         *   Fill in entries between the old length and the new length with
         *   nil.  Note that we don't have to fill in the very last element,
         *   since we'll explicitly set it to the new value momentarily
         *   anyway.  Note also that we don't need to keep undo for the
         *   initializations, since on undo we'll truncate the vector to
         *   remove the newly-added elements and thus won't need to restore
         *   any values for the slots.  
         */
        for (nil_val.set_nil() ; i < (size_t)idx - 1 ; ++i)
            set_element(i, &nil_val);

        /* 
         *   set the new value - this doesn't require undo since we had to
         *   expand the vector to make room for it 
         */
        set_element(idx - 1, new_val);
    }
    else
    {
        /* set the element and record undo, using a zero-based index */
        set_element_undo(vmg_ self, (size_t)idx - 1, new_val);
    }

    /* the result is the original vector value */
    new_container->set_obj(self);

    /* handled */
    return TRUE;
}